

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O0

int check(int classid,vector<paaword,_std::allocator<paaword>_> *tmp_result,int ENOUGH_COVER)

{
  undefined1 auVar1 [16];
  iterator iVar2;
  bool bVar3;
  ulong uVar4;
  void *pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference piVar8;
  double *pdVar9;
  size_type sVar10;
  reference pvVar11;
  double dVar12;
  int local_208;
  int local_204;
  int i_3;
  int cnt_wrong;
  key_type local_178 [2];
  int i_2;
  paaword local_168;
  double local_e0;
  int local_d4;
  iterator iStack_d0;
  int cov;
  _Self local_c8;
  iterator cov_it;
  double max_dis;
  paaword paa;
  int i_1;
  int i;
  int *cnt_cover;
  int ENOUGH_COVER_local;
  vector<paaword,_std::allocator<paaword>_> *tmp_result_local;
  int classid_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)data_n;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  for (paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < data_n;
      paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    *(undefined4 *)
     ((long)pvVar5 + (long)paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ * 4) =
         0;
  }
  for (paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
      uVar4 = (ulong)(int)paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count,
      sVar6 = std::vector<paaword,_std::allocator<paaword>_>::size(tmp_result), uVar4 < sVar6;
      paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    pvVar7 = std::vector<paaword,_std::allocator<paaword>_>::operator[]
                       (tmp_result,
                        (long)(int)paa.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count);
    paaword::paaword((paaword *)&max_dis,pvVar7);
    cov_it._M_node = (_Base_ptr)0xbff0000000000000;
    local_c8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &paa.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      iStack_d0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             &paa.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      bVar3 = std::operator!=(&local_c8,&stack0xffffffffffffff30);
      if (!bVar3) break;
      piVar8 = std::_Rb_tree_const_iterator<int>::operator*(&local_c8);
      local_d4 = *piVar8;
      paaword::paaword(&local_168,(paaword *)&max_dis);
      local_e0 = calculatedis(&local_168,local_d4);
      pdVar9 = std::max<double>((double *)&cov_it,&local_e0);
      cov_it._M_node = (_Base_ptr)*pdVar9;
      paaword::~paaword(&local_168);
      *(int *)((long)pvVar5 + (long)local_d4 * 4) = *(int *)((long)pvVar5 + (long)local_d4 * 4) + 1;
      std::_Rb_tree_const_iterator<int>::operator++(&local_c8);
    }
    cov_it._M_node = (_Base_ptr)(cov_it._M_node + 1e-08);
    for (local_178[0] = 0; local_178[0] < data_n; local_178[0] = local_178[0] + 1) {
      sVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          &paa.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_178);
      if (sVar10 == 0) {
        paaword::paaword((paaword *)&i_3,(paaword *)&max_dis);
        dVar12 = calculatedis((paaword *)&i_3,local_178[0]);
        iVar2 = cov_it;
        paaword::~paaword((paaword *)&i_3);
        if (dVar12 < (double)iVar2._M_node) {
          *(int *)((long)pvVar5 + (long)local_178[0] * 4) =
               *(int *)((long)pvVar5 + (long)local_178[0] * 4) + 1;
        }
      }
    }
    paaword::~paaword((paaword *)&max_dis);
  }
  local_204 = 0;
  for (local_208 = 0; local_208 < data_n; local_208 = local_208 + 1) {
    if ((ENOUGH_COVER <= *(int *)((long)pvVar5 + (long)local_208 * 4)) &&
       (pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&label,(long)local_208),
       *pvVar11 != classid)) {
      local_204 = local_204 + 1;
    }
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return local_204;
}

Assistant:

int check(int classid, vector<paaword> tmp_result, int ENOUGH_COVER) {
    int *cnt_cover = new int[data_n];
    for (int i = 0; i < data_n; ++i) {
        cnt_cover[i] = 0;
    }
//    for (paaword paa : tmp_result) {
    for (int i = 0; i < tmp_result.size(); ++i) {
        paaword paa = tmp_result[i];
        double max_dis = -1;
//        for (int cov : paa.cov) {
        for (set<int>::iterator cov_it = paa.cov.begin(); cov_it != paa.cov.end(); ++cov_it) {
            int cov = *cov_it;
            max_dis = max(max_dis, calculatedis(paa, cov));
            ++cnt_cover[cov];
        }
        max_dis += 1e-8;
        for (int i = 0; i < data_n; ++i) {
            if (!paa.cov.count(i)) {
                if (calculatedis(paa, i) < max_dis) {
                    ++cnt_cover[i];
                }
            }
        }
    }
//    printf("wrong cover ts:");
    int cnt_wrong = 0;
    for (int i = 0; i < data_n; ++i) {
        if (cnt_cover[i] >= ENOUGH_COVER && label[i] != classid) {
            ++cnt_wrong;
//            printf("%3d", i);
        }
    }
//    printf("\n");
    delete[] cnt_cover;
    return cnt_wrong;
}